

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

ExtensionInfo *
google::protobuf::internal::anon_unknown_58::FindRegisteredExtension
          (MessageLite *extendee,int number)

{
  EnumValidityFuncWithArg *pEVar1;
  undefined1 (*pauVar2) [16];
  EnumValidityFuncWithArg *pEVar3;
  TcParseTableBase *pTVar4;
  undefined1 auVar5 [16];
  anon_union_8_1_a8a14541_for_iterator_2 common;
  bool bVar6;
  uint32_t uVar7;
  undefined1 (*pauVar8) [16];
  size_t hash;
  anon_union_8_1_a8a14541_for_iterator_2 aVar9;
  reference pEVar10;
  slot_type *slot;
  slot_type *slot_00;
  MessageLite *extraout_RDX;
  MessageLite *pMVar11;
  ulong uVar12;
  void *pvVar13;
  ushort uVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  __m128i match;
  ctrl_t cVar18;
  code cVar20;
  code cVar21;
  code cVar22;
  code cVar23;
  code cVar24;
  code cVar25;
  code cVar26;
  code cVar27;
  code cVar28;
  code cVar29;
  code cVar30;
  code cVar31;
  code cVar32;
  code cVar33;
  code cVar34;
  undefined1 auVar19 [16];
  iterator iVar35;
  const_iterator it;
  ExtensionInfoKey info;
  anon_class_24_3_2b146c49 local_a0;
  MessageLite *local_88;
  int local_80 [2];
  undefined1 local_78 [16];
  const_iterator local_60;
  undefined1 local_50 [10];
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  
  common.slot_ = (anonymous_namespace)::global_registry.slot_;
  if ((anonymous_namespace)::global_registry.slot_ != (slot_type *)0x0) {
    local_88 = extendee;
    local_80[0] = number;
    if (1 < *(ulong *)&((anonymous_namespace)::global_registry.slot_)->number) {
      local_50._0_8_ =
           absl::lts_20240722::HashOf<const_google::protobuf::MessageLite_*,_int>
                     (&local_88,local_80);
      pMVar11 = (common.slot_)->message;
      if (pMVar11 < (MessageLite *)0x11) {
        pvVar13 = ((common.slot_)->field_6).enum_validity_check.arg;
        local_a0.this =
             (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
              *)common.slot_;
        local_a0.key = (ExtensionInfoKey *)&local_88;
        local_a0.hash_of_arg = (size_t *)local_50;
        pauVar2 = (undefined1 (*) [16])((common.slot_)->field_6).enum_validity_check.func;
        if (pMVar11 < (MessageLite *)0xf) {
          if ((MessageLite *)0x8 < pMVar11) {
            __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x753,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::internal::ExtensionInfo, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
          local_60.inner_.ctrl_ = *(ctrl_t **)(*pauVar2 + (long)pMVar11);
          local_60.inner_.ctrl_ =
               (ctrl_t *)
               absl::lts_20240722::container_internal::GroupPortableImpl::MaskFull
                         ((GroupPortableImpl *)&local_60);
          for (; local_60.inner_.ctrl_ != (ctrl_t *)0x0;
              local_60.inner_.ctrl_ =
                   (ctrl_t *)((ulong)(local_60.inner_.ctrl_ + -1) & (ulong)local_60.inner_.ctrl_)) {
            uVar7 = absl::lts_20240722::container_internal::NonIterableBitMask<unsigned_long,_8,_3>
                    ::LowestBitSet((NonIterableBitMask<unsigned_long,_8,_3> *)&local_60);
            absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
            ::
            AssertHashEqConsistent<google::protobuf::internal::(anonymous_namespace)::ExtensionInfoKey>
            ::anon_class_24_3_2b146c49::operator()
                      (&local_a0,(ctrl_t *)((long)pvVar13 + (ulong)uVar7 * 0x30 + -0x30),slot);
          }
        }
        else {
          uVar12 = *(ulong *)&(common.slot_)->number >> 1;
          local_78._0_8_ = uVar12;
          while (pauVar8 = pauVar2, uVar12 != 0) {
            auVar16 = *pauVar8;
            for (uVar14 = ~((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar16[0xf] >> 7) << 0xf); uVar14 != 0;
                uVar14 = uVar14 - 1 & uVar14) {
              uVar7 = absl::lts_20240722::container_internal::TrailingZeros<unsigned_short>(uVar14);
              if ((char)(*pauVar8)[uVar7] < '\0') {
                __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x764,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::internal::ExtensionInfo, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                             );
              }
              absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
              ::
              AssertHashEqConsistent<google::protobuf::internal::(anonymous_namespace)::ExtensionInfoKey>
              ::anon_class_24_3_2b146c49::operator()
                        (&local_a0,(ctrl_t *)((ulong)uVar7 * 0x30 + (long)pvVar13),slot_00);
              uVar12 = uVar12 - 1;
            }
            pvVar13 = (void *)((long)pvVar13 + 0x300);
            pauVar2 = pauVar8 + 1;
            if ((uVar12 != 0) && ((*pauVar8)[0xf] == -1)) {
              __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x76b,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::internal::ExtensionInfo, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                           );
            }
          }
          if ((ulong)local_78._0_8_ < *(ulong *)&(common.slot_)->number >> 1) {
            __assert_fail("original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x770,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::internal::ExtensionInfo, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
        }
      }
    }
    hash = absl::lts_20240722::HashOf<const_google::protobuf::MessageLite_*,_int>
                     (&local_88,local_80);
    absl::lts_20240722::container_internal::probe
              ((probe_seq<16UL> *)&local_a0,(CommonFields *)common.slot_,hash);
    pEVar3 = ((common.slot_)->field_6).enum_validity_check.func;
    auVar16 = ZEXT416((CONCAT11((char)hash,(char)hash) & 0xff7f) & 0xffff7fff);
    auVar16 = pshuflw(auVar16,auVar16,0);
    uVar15 = auVar16._0_4_;
    auVar16._4_4_ = uVar15;
    auVar16._0_4_ = uVar15;
    auVar16._8_4_ = uVar15;
    auVar16._12_4_ = uVar15;
    aVar9 = (anon_union_8_1_a8a14541_for_iterator_2)local_a0.this;
    pMVar11 = extraout_RDX;
    while( true ) {
      pEVar1 = pEVar3 + (long)&((CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                                 *)&(aVar9.slot_)->message)->
                               super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      ;
      auVar17[0] = -((EnumValidityFuncWithArg)auVar16[0] == *pEVar1);
      auVar17[1] = -(auVar16[1] == pEVar1[1]);
      auVar17[2] = -(auVar16[2] == pEVar1[2]);
      auVar17[3] = -(auVar16[3] == pEVar1[3]);
      auVar17[4] = -(auVar16[4] == pEVar1[4]);
      auVar17[5] = -(auVar16[5] == pEVar1[5]);
      auVar17[6] = -(auVar16[6] == pEVar1[6]);
      auVar17[7] = -(auVar16[7] == pEVar1[7]);
      auVar17[8] = -(auVar16[8] == pEVar1[8]);
      auVar17[9] = -(auVar16[9] == pEVar1[9]);
      auVar17[10] = -(auVar16[10] == pEVar1[10]);
      auVar17[0xb] = -(auVar16[0xb] == pEVar1[0xb]);
      auVar17[0xc] = -(auVar16[0xc] == pEVar1[0xc]);
      auVar17[0xd] = -(auVar16[0xd] == pEVar1[0xd]);
      auVar17[0xe] = -(auVar16[0xe] == pEVar1[0xe]);
      auVar17[0xf] = -(auVar16[0xf] == pEVar1[0xf]);
      cVar18 = (ctrl_t)*pEVar1;
      cVar20 = pEVar1[1];
      cVar21 = pEVar1[2];
      cVar22 = pEVar1[3];
      cVar23 = pEVar1[4];
      cVar24 = pEVar1[5];
      cVar25 = pEVar1[6];
      cVar26 = pEVar1[7];
      cVar27 = pEVar1[8];
      cVar28 = pEVar1[9];
      cVar29 = pEVar1[10];
      cVar30 = pEVar1[0xb];
      cVar31 = pEVar1[0xc];
      cVar32 = pEVar1[0xd];
      cVar33 = pEVar1[0xe];
      cVar34 = pEVar1[0xf];
      for (uVar14 = (ushort)(SUB161(auVar17 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar17[0xf] >> 7) << 0xf; auVar5._8_8_ = 0, auVar5._0_8_ = pMVar11,
          iVar35 = (iterator)(auVar5 << 0x40), uVar14 != 0; uVar14 = uVar14 - 1 & uVar14) {
        local_78 = auVar16;
        local_50[8] = cVar18;
        local_50[9] = cVar20;
        uStack_46 = cVar21;
        uStack_45 = cVar22;
        uStack_44 = cVar23;
        uStack_43 = cVar24;
        uStack_42 = cVar25;
        uStack_41 = cVar26;
        uStack_40 = cVar27;
        uStack_3f = cVar28;
        uStack_3e = cVar29;
        uStack_3d = cVar30;
        uStack_3c = cVar31;
        uStack_3b = cVar32;
        uStack_3a = cVar33;
        uStack_39 = cVar34;
        uVar7 = absl::lts_20240722::container_internal::TrailingZeros<unsigned_short>(uVar14);
        pTVar4 = ((common.slot_)->field_6).message_info.tc_table;
        uVar12 = (long)&((local_a0.this)->settings_).
                        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                        .value.capacity_ + (ulong)uVar7 & (ulong)local_a0.key;
        pMVar11 = (MessageLite *)(uVar12 * 0x30);
        if ((*(MessageLite **)((long)&pMVar11->_vptr_MessageLite + (long)&pTVar4->has_bits_offset)
             == local_88) && (*(int *)(&pTVar4->fast_idx_mask + (long)pMVar11) == local_80[0])) {
          iVar35 = absl::lts_20240722::container_internal::
                   raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                   ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                                  *)common.slot_,uVar12);
          goto LAB_0022ae31;
        }
        aVar9 = (anon_union_8_1_a8a14541_for_iterator_2)local_a0.this;
        auVar16 = local_78;
        cVar18 = local_50[8];
        cVar20 = local_50[9];
        cVar21 = uStack_46;
        cVar22 = uStack_45;
        cVar23 = uStack_44;
        cVar24 = uStack_43;
        cVar25 = uStack_42;
        cVar26 = uStack_41;
        cVar27 = uStack_40;
        cVar28 = uStack_3f;
        cVar29 = uStack_3e;
        cVar30 = uStack_3d;
        cVar31 = uStack_3c;
        cVar32 = uStack_3b;
        cVar33 = uStack_3a;
        cVar34 = uStack_39;
      }
      auVar19[0] = -(cVar18 == kEmpty);
      auVar19[1] = -(cVar20 == (code)0x80);
      auVar19[2] = -(cVar21 == (code)0x80);
      auVar19[3] = -(cVar22 == (code)0x80);
      auVar19[4] = -(cVar23 == (code)0x80);
      auVar19[5] = -(cVar24 == (code)0x80);
      auVar19[6] = -(cVar25 == (code)0x80);
      auVar19[7] = -(cVar26 == (code)0x80);
      auVar19[8] = -(cVar27 == (code)0x80);
      auVar19[9] = -(cVar28 == (code)0x80);
      auVar19[10] = -(cVar29 == (code)0x80);
      auVar19[0xb] = -(cVar30 == (code)0x80);
      auVar19[0xc] = -(cVar31 == (code)0x80);
      auVar19[0xd] = -(cVar32 == (code)0x80);
      auVar19[0xe] = -(cVar33 == (code)0x80);
      auVar19[0xf] = -(cVar34 == (code)0x80);
      if ((((((((((((((((auVar19 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar19 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar19 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar19 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar19 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar19 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar19 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar19 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar19 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar19 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar19 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar19 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          cVar34 == (code)0x80) break;
      pMVar11 = (MessageLite *)((long)local_a0.hash_of_arg + 0x10);
      aVar9.slot_ = (slot_type *)
                    ((long)&((CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                              *)&(aVar9.slot_)->field_6)->
                            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     + (long)local_a0.hash_of_arg & (ulong)local_a0.key);
      local_a0.this =
           (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
            *)aVar9.slot_;
      local_a0.hash_of_arg = (size_t *)pMVar11;
      if ((common.slot_)->message < pMVar11) {
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xdbd,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::(anonymous namespace)::ExtensionInfoKey]"
                     );
      }
    }
LAB_0022ae31:
    local_60.inner_.ctrl_ = (ctrl_t *)0x0;
    local_a0._0_16_ = iVar35;
    bVar6 = absl::lts_20240722::container_internal::operator==
                      ((const_iterator *)&local_a0,&local_60);
    if (!bVar6) {
      pEVar10 = absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                ::iterator::operator*((iterator *)&local_a0);
      return pEVar10;
    }
  }
  return (ExtensionInfo *)0x0;
}

Assistant:

const ExtensionInfo* FindRegisteredExtension(const MessageLite* extendee,
                                             int number) {
  if (!global_registry) return nullptr;

  ExtensionInfoKey info;
  info.message = extendee;
  info.number = number;

  auto it = global_registry->find(info);
  if (it == global_registry->end()) {
    return nullptr;
  } else {
    return &*it;
  }
}